

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  undefined1 uVar1;
  tm *ptVar2;
  bool local_a2;
  undefined1 local_a0 [8];
  tm_conflict1 tmbuf;
  tm_conflict1 *ltime;
  long lStack_58;
  int i;
  time_t Julian;
  char DaysInMonth [12];
  time_t Seconds_local;
  time_t Minutes_local;
  time_t Hours_local;
  time_t Year_local;
  time_t Day_local;
  time_t Month_local;
  
  DaysInMonth._4_8_ = Seconds;
  builtin_strncpy(DaysInMonth,"\x1e\x1f\x1e\x1f",4);
  if (Year < 0x45) {
    Hours_local = Year + 2000;
  }
  else {
    Hours_local = Year;
    if (Year < 100) {
      Hours_local = Year + 0x76c;
    }
  }
  local_a2 = false;
  if (Hours_local % 4 == 0) {
    local_a2 = Hours_local % 100 != 0 || Hours_local % 400 == 0;
  }
  uVar1 = 0x1c;
  if (local_a2) {
    uVar1 = 0x1d;
  }
  stack0xffffffffffffffb4 = CONCAT62(0x1f1f1e1f1e1f,CONCAT11(uVar1,0x1f));
  if (((((Hours_local < 0x7b2) || (0x7f5 < Hours_local)) || (Month < 1)) ||
      ((((0xc < Month || (Day < 1)) ||
        ((*(char *)((long)&Julian + (long)(int)(Month + -1) + 4) < Day ||
         ((Hours < 0 || (0x17 < Hours)))))) || (Minutes < 0)))) ||
     (((0x3b < Minutes || (Seconds < 0)) || (0x3b < Seconds)))) {
    Month_local = -1;
  }
  else {
    lStack_58 = Day + -1;
    for (ltime._4_4_ = 0; (long)ltime._4_4_ < Month + -1; ltime._4_4_ = ltime._4_4_ + 1) {
      lStack_58 = *(char *)((long)&Julian + (long)ltime._4_4_ + 4) + lStack_58;
    }
    for (ltime._4_4_ = 0x7b2; ltime._4_4_ < Hours_local; ltime._4_4_ = ltime._4_4_ + 1) {
      lStack_58 = (int)((ltime._4_4_ % 4 == 0) + 0x16d) + lStack_58;
    }
    lStack_58 = Hours * 0xe10 + Minutes * 0x3c + Seconds + Timezone + lStack_58 * 0x15180;
    ptVar2 = localtime_r(&stack0xffffffffffffffa8,(tm *)local_a0);
    if ((DSTmode == DSTon) || ((DSTmode == DSTmaybe && (ptVar2->tm_isdst != 0)))) {
      lStack_58 = lStack_58 + -0xe10;
    }
    Month_local = lStack_58;
  }
  return Month_local;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	signed char DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t		Julian;
	int		i;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
	struct tm	tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
	errno_t		terr;
	__time64_t	tmptime;
#endif

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year >= 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
#if defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Julian, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = Julian;
	terr = _localtime64_s(&tmbuf, &tmptime);
	if (terr)
		ltime = NULL;
	else
		ltime = &tmbuf;
#else
	ltime = localtime(&Julian);
#endif
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && ltime->tm_isdst))
		Julian -= HOUR;
	return Julian;
}